

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O2

int Mio_ParseCheckName(Mio_Gate_t *pGate,char **ppStr)

{
  int iVar1;
  Mio_Pin_t *pPin;
  char *__s2;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s_00;
  int iVar5;
  int local_34;
  
  pPin = Mio_GateReadPins(pGate);
  local_34 = -1;
  iVar5 = 0;
  __s_00 = (char *)0x0;
  do {
    if (pPin == (Mio_Pin_t *)0x0) {
      if (__s_00 != (char *)0x0) {
        sVar2 = strlen(__s_00);
        *ppStr = *ppStr + (sVar2 - 1);
      }
      return local_34;
    }
    pcVar3 = *ppStr;
    __s2 = Mio_PinReadName(pPin);
    __s = Mio_PinReadName(pPin);
    sVar2 = strlen(__s);
    iVar1 = strncmp(pcVar3,__s2,sVar2);
    if (iVar1 == 0) {
      if (__s_00 != (char *)0x0) {
        sVar2 = strlen(__s_00);
        pcVar3 = Mio_PinReadName(pPin);
        sVar4 = strlen(pcVar3);
        if (sVar4 <= sVar2) goto LAB_00304338;
      }
      __s_00 = Mio_PinReadName(pPin);
      local_34 = iVar5;
    }
LAB_00304338:
    pPin = Mio_PinReadNext(pPin);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int Mio_ParseCheckName( Mio_Gate_t * pGate, char ** ppStr )
{
    Mio_Pin_t * pPin;
    int i, iBest = -1;
    // find the longest pin name that matches substring
    char * pNameBest = NULL;
    for ( pPin = Mio_GateReadPins(pGate), i = 0; pPin; pPin = Mio_PinReadNext(pPin), i++ )
        if ( !strncmp( *ppStr, Mio_PinReadName(pPin), strlen(Mio_PinReadName(pPin)) ) )
            if ( pNameBest == NULL || strlen(pNameBest) < strlen(Mio_PinReadName(pPin)) )
                pNameBest = Mio_PinReadName(pPin), iBest = i;
    // if pin is not found, return -1
    if ( pNameBest )
        *ppStr += strlen(pNameBest) - 1;
    return iBest;
}